

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O3

bool pvmath::lineConstructor<float>(void)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001304 [12];
  PointBase2D<float> point2;
  PointBase2D<float> point1;
  LineBase2D<float> line;
  PointBase2D<float> local_40;
  PointBase2D<float> local_38;
  LineBase2D<float> local_30;
  
  uVar1 = Test_Helper::runCount();
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      iVar2 = rand();
      auVar7._0_4_ = (float)(iVar2 % 200000);
      auVar7._4_12_ = in_register_00001304;
      auVar6 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0x3c23d70a),0),SUB6416(ZEXT464(0xc47a0000),0))
      ;
      iVar2 = rand();
      auVar4._0_4_ = (float)(iVar2 % 200000);
      auVar4._4_12_ = in_register_00001304;
      auVar4 = vfmadd213ss_fma(auVar4,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      local_38.y = auVar4._0_4_;
      local_38.x = auVar6._0_4_;
      iVar2 = rand();
      auVar6._0_4_ = (float)(iVar2 % 200000);
      auVar6._4_12_ = in_register_00001304;
      auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      iVar2 = rand();
      auVar5._0_4_ = (float)(iVar2 % 200000);
      auVar5._4_12_ = in_register_00001304;
      auVar4 = vfmadd213ss_fma(auVar5,SUB6416(ZEXT464(0x3c23d70a),0),ZEXT416(0xc47a0000));
      local_40.y = auVar4._0_4_;
      local_40.x = auVar6._0_4_;
      LineBase2D<float>::LineBase2D(&local_30,&local_38,&local_40);
      uVar3 = uVar3 + 1;
      uVar1 = Test_Helper::runCount();
    } while (uVar3 < uVar1);
  }
  return true;
}

Assistant:

bool lineConstructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line( point1, point2 );
        }
        return true;
    }